

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_streambuf.hpp
# Opt level: O0

void __thiscall
asio::basic_streambuf<std::allocator<char>_>::reserve
          (basic_streambuf<std::allocator<char>_> *this,size_t n)

{
  long lVar1;
  reference pvVar2;
  reference pvVar3;
  vector<char,_std::allocator<char>_> *this_00;
  char *pcVar4;
  ulong in_RSI;
  char *in_RDI;
  length_error ex;
  size_t pend;
  size_t pnext;
  size_t gnext;
  length_error *in_stack_ffffffffffffff60;
  size_type in_stack_ffffffffffffff78;
  length_error local_40 [16];
  unsigned_long local_30;
  unsigned_long local_28;
  ulong local_20;
  long local_18;
  ulong local_10;
  
  local_10 = in_RSI;
  lVar1 = std::streambuf::gptr();
  pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x48),0);
  local_18 = lVar1 - (long)pvVar2;
  lVar1 = std::streambuf::pptr();
  pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x48),0);
  local_20 = lVar1 - (long)pvVar2;
  lVar1 = std::streambuf::epptr();
  pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x48),0);
  local_28 = lVar1 - (long)pvVar2;
  if (local_28 - local_20 < local_10) {
    if (local_18 != 0) {
      local_20 = local_20 - local_18;
      pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x48),0);
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x48),0);
      memmove(pvVar2,pvVar3 + local_18,local_20);
    }
    if (local_28 - local_20 < local_10) {
      if ((*(ulong *)(in_RDI + 0x40) < local_10) || (*(long *)(in_RDI + 0x40) - local_10 < local_20)
         ) {
        std::length_error::length_error(local_40,"asio::streambuf too long");
        detail::throw_exception<std::length_error>(in_stack_ffffffffffffff60);
        std::length_error::~length_error(local_40);
      }
      else {
        local_28 = local_20 + local_10;
        this_00 = (vector<char,_std::allocator<char>_> *)(in_RDI + 0x48);
        local_30 = 1;
        std::max<unsigned_long>(&local_28,&local_30);
        std::vector<char,_std::allocator<char>_>::resize(this_00,in_stack_ffffffffffffff78);
      }
    }
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x48),0);
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x48),0);
    std::vector<char,_std::allocator<char>_>::operator[]
              ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x48),0);
    std::streambuf::setg(in_RDI,pvVar2,pvVar3);
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x48),0);
    pcVar4 = pvVar2 + local_20;
    std::vector<char,_std::allocator<char>_>::operator[]
              ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x48),0);
    std::streambuf::setp(in_RDI,pcVar4);
  }
  return;
}

Assistant:

void reserve(std::size_t n)
  {
    // Get current stream positions as offsets.
    std::size_t gnext = gptr() - &buffer_[0];
    std::size_t pnext = pptr() - &buffer_[0];
    std::size_t pend = epptr() - &buffer_[0];

    // Check if there is already enough space in the put area.
    if (n <= pend - pnext)
    {
      return;
    }

    // Shift existing contents of get area to start of buffer.
    if (gnext > 0)
    {
      pnext -= gnext;
      std::memmove(&buffer_[0], &buffer_[0] + gnext, pnext);
    }

    // Ensure buffer is large enough to hold at least the specified size.
    if (n > pend - pnext)
    {
      if (n <= max_size_ && pnext <= max_size_ - n)
      {
        pend = pnext + n;
        buffer_.resize((std::max<std::size_t>)(pend, 1));
      }
      else
      {
        std::length_error ex("asio::streambuf too long");
        asio::detail::throw_exception(ex);
      }
    }

    // Update stream positions.
    setg(&buffer_[0], &buffer_[0], &buffer_[0] + pnext);
    setp(&buffer_[0] + pnext, &buffer_[0] + pend);
  }